

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall setup::info::info(info *this)

{
  version *in_RDI;
  header *in_stack_00000130;
  
  setup::version::version(in_RDI);
  in_RDI[1].value = 0;
  header::header(in_stack_00000130);
  std::vector<setup::component_entry,_std::allocator<setup::component_entry>_>::vector
            ((vector<setup::component_entry,_std::allocator<setup::component_entry>_> *)0x17962e);
  std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::vector
            ((vector<setup::data_entry,_std::allocator<setup::data_entry>_> *)0x17963f);
  std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::vector
            ((vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *)0x179650);
  std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::vector
            ((vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *)0x179661);
  std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>::vector
            ((vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *)0x179672);
  std::vector<setup::file_entry,_std::allocator<setup::file_entry>_>::vector
            ((vector<setup::file_entry,_std::allocator<setup::file_entry>_> *)0x179683);
  std::vector<setup::icon_entry,_std::allocator<setup::icon_entry>_>::vector
            ((vector<setup::icon_entry,_std::allocator<setup::icon_entry>_> *)0x179694);
  std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::vector
            ((vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *)0x1796a5);
  std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::vector
            ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)0x1796b6);
  std::vector<setup::message_entry,_std::allocator<setup::message_entry>_>::vector
            ((vector<setup::message_entry,_std::allocator<setup::message_entry>_> *)0x1796c7);
  std::vector<setup::permission_entry,_std::allocator<setup::permission_entry>_>::vector
            ((vector<setup::permission_entry,_std::allocator<setup::permission_entry>_> *)0x1796d8);
  std::vector<setup::registry_entry,_std::allocator<setup::registry_entry>_>::vector
            ((vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *)0x1796e9);
  std::vector<setup::run_entry,_std::allocator<setup::run_entry>_>::vector
            ((vector<setup::run_entry,_std::allocator<setup::run_entry>_> *)0x1796fa);
  std::vector<setup::run_entry,_std::allocator<setup::run_entry>_>::vector
            ((vector<setup::run_entry,_std::allocator<setup::run_entry>_> *)0x17970b);
  std::vector<setup::task_entry,_std::allocator<setup::task_entry>_>::vector
            ((vector<setup::task_entry,_std::allocator<setup::task_entry>_> *)0x17971c);
  std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::vector
            ((vector<setup::type_entry,_std::allocator<setup::type_entry>_> *)0x17972d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17973e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17974f);
  std::__cxx11::string::string((string *)&in_RDI[0x58].known);
  std::__cxx11::string::string((string *)(in_RDI + 0x5a));
  return;
}

Assistant:

info::info() : codepage(0) { }